

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O0

int raviX_generate_C(LinearizerState *linearizer,TextBuffer *mb,
                    Ravi_CompilerInterface *ravi_interface)

{
  int iVar1;
  Ravi_CompilerInterface *local_28;
  Ravi_CompilerInterface *ravi_interface_local;
  TextBuffer *mb_local;
  LinearizerState *linearizer_local;
  
  local_28 = ravi_interface;
  if (ravi_interface == (Ravi_CompilerInterface *)0x0) {
    local_28 = &stub_compilerInterface;
  }
  raviX_create_string(linearizer->compiler_state,"_ENV",4);
  raviX_buffer_add_string
            (mb,
             "#ifdef __MIRC__\ntypedef __SIZE_TYPE__ size_t;\ntypedef __PTRDIFF_TYPE__ ptrdiff_t;\ntypedef __INTPTR_TYPE__ intptr_t;\ntypedef __INT64_TYPE__ int64_t;\ntypedef __UINT64_TYPE__ uint64_t;\ntypedef __INT32_TYPE__ int32_t;\ntypedef __UINT32_TYPE__ uint32_t;\ntypedef __INT16_TYPE__ int16_t;\ntypedef __UINT16_TYPE__ uint16_t;\ntypedef __INT8_TYPE__ int8_t;\ntypedef __UINT8_TYPE__ uint8_t;\n#define NULL ((void *)0)\n#define EXPORT\n#else\n#include <stddef.h>\n#include <stdint.h>\n#ifdef _WIN32\n#define EXPORT __declspec(dllexport)\n#else\n#define EXPORT\n#endif\n#endif\ntypedef size_t lu_mem;\ntypedef unsigned char lu_byte;\ntypedef uint16_t LuaType;\ntypedef struct lua_State lua_State;\n#define LUA_TNONE\t\t(-1)\n#define LUA_TNIL\t\t0\n#define LUA_TBOOLEAN\t\t1\n#define LUA_TLIGHTUSERDATA\t2\n#define LUA_TNUMBER\t\t3\n#define LUA_TSTRING\t\t4\n#define LUA_TTABLE\t\t5\n#define LUA_TFUNCTION\t\t6\n#define LUA_TUSERDATA\t\t7\n#define LUA_TTHREAD\t\t8\n#define LUA_OK  0\ntypedef enum {TM_INDEX,TM_NEWINDEX,TM_GC,\n\tTM_MODE,TM_LEN,TM_EQ,TM_ADD,TM_SUB,TM_MUL,\n\tTM_MOD,TM_POW,TM_DIV,TM_IDIV,TM_BAND,TM_BOR,\n\tTM_BXOR,TM_SHL,TM_SHR,TM_UNM,TM_BNOT,TM_LT,\n\tTM_LE,TM_CONCAT,TM_CALL,TM_N\n} TMS;\ntypedef double lua_Number;\ntypedef int64_t lua_Integer;\ntypedef uint64_t lua_Unsigned;\ntypedef int (*lua_CFunction) (lua_State *L);\ntypedef union {\n\tlua_Number n;\n\tdouble u;\n\tvoid *s;\n\tlua_Integer i;\n\tlong l;\n} L_Umaxalign;\n#define lua_assert(c)\t\t((void)0)\n#define check_exp(c,e)\t\t(e)\n#define lua_longassert(c)\t((void)0)\n#define luai_apicheck(l,e)\tlua_assert(e)\n#define api_check(l,e,msg)\tluai_apicheck(l,(e) && msg)\n#define UNUSED(x)\t((void)(x))\n#define cast(t, exp)\t((t)(exp))\n#define cast_void(i)\tcast(void, (i))\n#define cast_byte(i)\tcast(lu_byte, (i))\n#define cast_num(i)\tcast(lua_Number, (i))\n#define cast_int(i)\tcast(int, (i))\n#define cast_uchar(i)\tcast(unsigned char, (i))\n#define l_castS2U(i)\t((lua_Unsigned)(i))\n#define l_castU2S(i)\t((lua_Integer)(i))\n#define l_noret\t\tvoid\ntypedef unsigned int Instruction;\n#define luai_numidiv(L,a,b)     ((void)L, l_floor(luai_numdiv(L,a,b)))\n#define luai_numdiv(L,a,b)..." /* TRUNCATED STRING LITERAL */
            );
  iVar1 = emit_C__decl(linearizer,local_28,mb);
  if (iVar1 == 0) {
    preprocess_upvalues(linearizer->main_proc);
    iVar1 = generate_C_code(local_28,linearizer->main_proc,mb);
    if (iVar1 == 0) {
      generate_lua_closure(linearizer->main_proc,local_28->main_func_name,mb);
      linearizer_local._4_4_ = 0;
    }
    else {
      linearizer_local._4_4_ = -1;
    }
  }
  else {
    linearizer_local._4_4_ = -1;
  }
  return linearizer_local._4_4_;
}

Assistant:

int raviX_generate_C(LinearizerState *linearizer, TextBuffer *mb, struct Ravi_CompilerInterface *ravi_interface)
{
	if (ravi_interface == NULL)
		ravi_interface = &stub_compilerInterface;

	// _ENV is the name of the Lua up-value that points to the globals table
	raviX_create_string(linearizer->compiler_state, "_ENV", 4);

	/* Add the common header portion */
	// FIXME we need a way to customise this for 32-bit vs 64-bit
	raviX_buffer_add_string(mb, Lua_header);

	/* emit C__decl statements in ravi code */
	if (emit_C__decl(linearizer, ravi_interface, mb) != 0) {
		return -1;
	}

	/* Preprocess upvalue attributes */
	preprocess_upvalues(linearizer->main_proc);

	/* Recursively generate C code for procs */
	if (generate_C_code(ravi_interface, linearizer->main_proc, mb) != 0) {
		return -1;
	}
	generate_lua_closure(linearizer->main_proc, ravi_interface->main_func_name, mb);
	return 0;
}